

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

smart_ptr<re2c::DFA> __thiscall
re2c::compile(re2c *this,Spec *spec,Output *output,string *cond,uint32_t cunits)

{
  bool bVar1;
  reference __x;
  Skeleton *this_00;
  DFA *this_01;
  unsigned_long *puVar2;
  long *extraout_RDX;
  smart_ptr<re2c::DFA> sVar3;
  DFA *adfa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fill;
  Skeleton *skeleton;
  dfa_t dfa;
  nfa_t nfa;
  _Self local_d0;
  const_iterator i;
  charset_t cs;
  value_type_conflict1 local_90 [4];
  undefined1 local_80 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> bounds;
  string name;
  uint32_t line;
  uint32_t cunits_local;
  string *cond_local;
  Output *output_local;
  Spec *spec_local;
  
  name.field_2._12_4_ = cunits;
  name.field_2._8_4_ = OutputFile::get_block_line(&output->source);
  make_name((string *)&bounds._M_t._M_impl.super__Rb_tree_header._M_node_count,cond,
            name.field_2._8_4_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_80);
  (*spec->re->_vptr_RegExp[2])
            (spec->re,(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      local_80);
  local_90[0] = 0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_80,
             local_90);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_80,
             (value_type_conflict1 *)(name.field_2._M_local_buf + 0xc));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  local_d0._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  local_80);
  while( true ) {
    nfa.root = (nfa_state_t *)
               std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_80);
    bVar1 = std::operator!=(&local_d0,(_Self *)&nfa.root);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,__x);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_d0);
  }
  nfa_t::nfa_t((nfa_t *)&dfa.nchars,spec->re);
  dfa_t::dfa_t((dfa_t *)&skeleton,(nfa_t *)&dfa.nchars,(charset_t *)&i,&spec->rules);
  this_00 = (Skeleton *)operator_new(0x90);
  Skeleton::Skeleton(this_00,(dfa_t *)&skeleton,(charset_t *)&i,&spec->rules,
                     (string *)&bounds._M_t._M_impl.super__Rb_tree_header._M_node_count,cond,
                     name.field_2._8_4_);
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
  minimization((dfa_t *)&skeleton);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&adfa);
  fillpoints((dfa_t *)&skeleton,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&adfa);
  this_01 = (DFA *)operator_new(0x88);
  DFA::DFA(this_01,(dfa_t *)&skeleton,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&adfa
           ,(Skeleton *)
            fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,(charset_t *)&i,
           (string *)&bounds._M_t._M_impl.super__Rb_tree_header._M_node_count,cond,
           name.field_2._8_4_);
  DFA::reorder(this_01);
  DFA::prepare(this_01);
  DFA::calc_stats(this_01);
  puVar2 = std::max<unsigned_long>(&output->max_fill,&this_01->max_fill);
  output->max_fill = *puVar2;
  if ((this_01->need_accept & 1U) != 0) {
    OutputFile::set_used_yyaccept(&output->source);
  }
  make_smart_ptr<re2c::DFA>(this,this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&adfa);
  dfa_t::~dfa_t((dfa_t *)&skeleton);
  nfa_t::~nfa_t((nfa_t *)&dfa.nchars);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_80);
  std::__cxx11::string::~string((string *)&bounds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar3.count = extraout_RDX;
  sVar3.ptr = (DFA *)this;
  return sVar3;
}

Assistant:

smart_ptr<DFA> compile (Spec & spec, Output & output, const std::string & cond, uint32_t cunits)
{
	const uint32_t line = output.source.get_block_line();
	const std::string name = make_name(cond, line);

	// The original set of code units (charset) might be very large.
	// A common trick it is to split charset into disjoint character ranges
	// and choose a representative of each range (we choose lower bound).
	// The set of all representatives is the new (compacted) charset.
	// Don't forget to include zero and upper bound, even if they
	// do not explicitely apper in ranges.
	std::set<uint32_t> bounds;
	spec.re->split(bounds);
	bounds.insert(0);
	bounds.insert(cunits);
	charset_t cs;
	for (std::set<uint32_t>::const_iterator i = bounds.begin(); i != bounds.end(); ++i)
	{
		cs.push_back(*i);
	}

	nfa_t nfa(spec.re);

	dfa_t dfa(nfa, cs, spec.rules);

	// skeleton must be constructed after DFA construction
	// but prior to any other DFA transformations
	Skeleton *skeleton = new Skeleton(dfa, cs, spec.rules, name, cond, line);

	minimization(dfa);

	// find YYFILL states and calculate argument to YYFILL
	std::vector<size_t> fill;
	fillpoints(dfa, fill);

	// ADFA stands for 'DFA with actions'
	DFA *adfa = new DFA(dfa, fill, skeleton, cs, name, cond, line);

	/*
	 * note [reordering DFA states]
	 *
	 * re2c-generated code depends on the order of states in DFA: simply
	 * flipping two states may change the output significantly.
	 * The order of states is affected by many factors, e.g.:
	 *   - flipping left and right subtrees of alternative when constructing
	 *     AST (also applies to iteration and counted repetition)
	 *   - changing the order in which graph nodes are visited (applies to
	 *     any intermediate representation: bytecode, NFA, DFA, etc.)
	 *
	 * To make the resulting code independent of such changes, we hereby
	 * reorder DFA states. The ordering scheme is very simple:
	 *
	 * Starting with DFA root, walk DFA nodes in breadth-first order.
	 * Child nodes are ordered accoding to the (alphabetically) first symbol
	 * leading to each node. Each node must be visited exactly once.
	 * Default state (NULL) is always the last state.
	 */
	adfa->reorder();

	// skeleton is constructed, do further DFA transformations
	adfa->prepare();

	// finally gather overall DFA statistics
	adfa->calc_stats();

	// accumulate global statistics from this particular DFA
	output.max_fill = std::max (output.max_fill, adfa->max_fill);
	if (adfa->need_accept)
	{
		output.source.set_used_yyaccept ();
	}

	return make_smart_ptr(adfa);
}